

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.c
# Opt level: O0

int ffgtam(fitsfile *gfptr,fitsfile *mfptr,int hdupos,int *status)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  bool bVar4;
  int local_2838;
  char local_2808 [8];
  char tmp [1025];
  int local_23fc;
  fitsfile *pfStack_23f8;
  int parentStatus;
  fitsfile *tmpfptr;
  char local_23e8 [7];
  uchar charNull [1];
  char card [81];
  char local_2388 [8];
  char keyword [75];
  char *local_2330;
  char *tmpPtr [1];
  char *keys [6];
  char cwd [1025];
  char local_1ee8 [8];
  char grootname [1025];
  char local_1ad8 [8];
  char tmprootname [1025];
  char local_16c8 [8];
  char groupLocation [1025];
  char local_12b8 [8];
  char groupFileName [1025];
  char local_ea8 [8];
  char groupAccess2 [71];
  char local_e58 [8];
  char groupAccess1 [71];
  char local_e08 [4];
  char memberURI [4];
  char memberExtname [71];
  char local_db8 [8];
  char memberHDUtype [71];
  char *tgrplc;
  char grplc [1025];
  char local_958 [8];
  char memberLocation [1025];
  char local_548 [8];
  char memberFileName [1025];
  char local_138 [8];
  char memberAccess2 [71];
  char local_e8 [8];
  char memberAccess1 [71];
  long grpid;
  long ngroups;
  long nmembers;
  long memberID;
  long groupExtver;
  long memberExtver;
  int iomode;
  int groupIOstate;
  int memberIOstate;
  int i;
  int found;
  int nkeys;
  int useLocation;
  int hdutype;
  int grptype;
  int memberPosition;
  int uriCol;
  int locationCol;
  int positionCol;
  int extverCol;
  int extnameCol;
  int xtensionCol;
  int *status_local;
  fitsfile *pfStack_20;
  int hdupos_local;
  fitsfile *mfptr_local;
  fitsfile *gfptr_local;
  
  hdutype = 0;
  useLocation = 0;
  nkeys = 0;
  found = 0;
  i = 6;
  groupExtver = 0;
  memberID = 0;
  nmembers = 0;
  ngroups = 0;
  grpid = 0;
  stack0xffffffffffffff60 = 0;
  stack0xfffffffffffff1f4 = 0x4c5255;
  _extnameCol = status;
  status_local._4_4_ = hdupos;
  pfStack_20 = mfptr;
  mfptr_local = gfptr;
  memcpy(tmpPtr,&PTR_anon_var_dwarf_46cd2_002b7580,0x30);
  memset((void *)((long)&tmpfptr + 7),0,1);
  pfStack_23f8 = (fitsfile *)0x0;
  local_23fc = 0;
  if (*_extnameCol != 0) {
    return *_extnameCol;
  }
  ffflmd(mfptr_local,(int *)&memberExtver,_extnameCol);
  if ((int)memberExtver == 1) {
    if (pfStack_20 == (fitsfile *)0x0) {
      iVar1 = ffreopen(mfptr_local,&stack0xffffffffffffdc08,_extnameCol);
      *_extnameCol = iVar1;
      iVar1 = ffmahd(pfStack_23f8,status_local._4_4_,&nkeys,_extnameCol);
      *_extnameCol = iVar1;
      if (*_extnameCol != 0) goto LAB_00212c17;
    }
    else {
      pfStack_23f8 = pfStack_20;
    }
    iVar1 = ffgkys(pfStack_23f8,"XTENSION",local_db8,local_23e8,_extnameCol);
    *_extnameCol = iVar1;
    if (*_extnameCol == 0xca) {
      strcpy(local_db8,"PRIMARY");
      *_extnameCol = 0;
    }
    prepare_keyvalue(local_db8);
    iVar1 = ffgkyj(pfStack_23f8,"EXTVER",&groupExtver,local_23e8,_extnameCol);
    *_extnameCol = iVar1;
    if (*_extnameCol == 0xca) {
      groupExtver = 1;
      *_extnameCol = 0;
    }
    iVar1 = ffgkys(pfStack_23f8,"EXTNAME",local_e08,local_23e8,_extnameCol);
    *_extnameCol = iVar1;
    if (*_extnameCol == 0xca) {
      local_e08[0] = '\0';
      *_extnameCol = 0;
    }
    prepare_keyvalue(local_e08);
    ffghdn(pfStack_23f8,&hdutype);
    found = 1;
    iVar1 = fits_get_url(pfStack_23f8,local_548,local_958,local_e8,local_138,&iomode,_extnameCol);
    *_extnameCol = iVar1;
    sVar2 = strlen(local_548);
    if (sVar2 == 0) {
      strcpy(local_548,local_958);
      strcpy(local_e8,local_138);
    }
    iVar1 = fits_get_url(mfptr_local,local_12b8,local_16c8,local_e58,local_ea8,
                         (int *)((long)&memberExtver + 4),_extnameCol);
    *_extnameCol = iVar1;
    if (*_extnameCol == 0) {
      if (memberExtver._4_4_ == 0) {
        ffpmsg("cannot modify grouping table (ffgtam)");
        *_extnameCol = 0x15d;
      }
      else {
        iVar1 = fits_strcasecmp(local_e58,"file://");
        if ((iVar1 == 0) || (iVar1 = fits_strcasecmp(local_e8,"file://"), iVar1 == 0)) {
          iVar1 = fits_get_cwd((char *)(keys + 5),_extnameCol);
          *_extnameCol = iVar1;
          iVar1 = fits_strcasecmp(local_e8,"file://");
          if (iVar1 == 0) {
            if (local_548[0] == '/') {
              strcpy(local_958,local_548);
            }
            else {
              strcpy(local_958,(char *)(keys + 5));
              sVar2 = strlen(local_958);
              sVar3 = strlen(local_548);
              if (0x400 < sVar2 + sVar3 + 1) {
                ffpmsg("member path and filename is too long (ffgtam)");
                *_extnameCol = 0x7d;
                goto LAB_00212c17;
              }
              strcat(local_958,"/");
              strcat(local_958,local_548);
            }
            iVar1 = fits_clean_url(local_958,local_548,_extnameCol);
            *_extnameCol = iVar1;
          }
          iVar1 = fits_strcasecmp(local_e58,"file://");
          if (iVar1 == 0) {
            if (local_12b8[0] == '/') {
              strcpy(local_16c8,local_12b8);
            }
            else {
              strcpy(local_16c8,(char *)(keys + 5));
              sVar2 = strlen(local_16c8);
              sVar3 = strlen(local_12b8);
              if (0x400 < sVar2 + sVar3 + 1) {
                ffpmsg("group path and filename is too long (ffgtam)");
                *_extnameCol = 0x7d;
                goto LAB_00212c17;
              }
              strcat(local_16c8,"/");
              strcat(local_16c8,local_12b8);
            }
            iVar1 = fits_clean_url(local_16c8,local_12b8,_extnameCol);
            *_extnameCol = iVar1;
          }
          iVar1 = fits_strcasecmp(local_e58,"file://");
          if ((iVar1 == 0) && (iVar1 = fits_strcasecmp(local_e8,"file://"), iVar1 == 0)) {
            fits_url2relurl(local_548,local_12b8,local_16c8,_extnameCol);
            fits_url2relurl(local_12b8,local_548,local_958,_extnameCol);
            strcpy(local_548,local_958);
            strcpy(local_12b8,local_16c8);
          }
        }
        else {
          keys[5]._0_1_ = 0;
        }
        iVar1 = ffgkyj(mfptr_local,"EXTVER",&memberID,local_23e8,_extnameCol);
        *_extnameCol = iVar1;
        ffrtnm(pfStack_23f8->Fptr->filename,local_1ad8,_extnameCol);
        ffrtnm(mfptr_local->Fptr->filename,local_1ee8,_extnameCol);
        if ((pfStack_23f8->Fptr != mfptr_local->Fptr) &&
           (iVar1 = strncmp(local_1ad8,local_1ee8,0x401), iVar1 != 0)) {
          memberID = -memberID;
        }
        iVar1 = ffgtnm(mfptr_local,&ngroups,_extnameCol);
        *_extnameCol = iVar1;
        iVar1 = ffgmf(mfptr_local,local_db8,local_e08,(int)groupExtver,hdutype,local_548,&nmembers,
                      _extnameCol);
        *_extnameCol = iVar1;
        if (*_extnameCol == 0x156) {
          *_extnameCol = 0;
          iVar1 = ffirow(mfptr_local,ngroups,1,_extnameCol);
          *_extnameCol = iVar1;
          ngroups = ngroups + 1;
          iVar1 = ffgtgc(mfptr_local,&extverCol,&positionCol,&locationCol,&uriCol,&memberPosition,
                         &grptype,&useLocation,_extnameCol);
          *_extnameCol = iVar1;
          local_2330 = local_db8;
          if (extverCol != 0) {
            ffpcls(mfptr_local,extverCol,ngroups,1,1,&local_2330,_extnameCol);
          }
          local_2330 = local_e08;
          if (positionCol != 0) {
            sVar2 = strlen(local_e08);
            if (sVar2 == 0) {
              ffpclb(mfptr_local,positionCol,ngroups,1,1,(uchar *)((long)&tmpfptr + 7),_extnameCol);
            }
            else {
              ffpcls(mfptr_local,positionCol,ngroups,1,1,&local_2330,_extnameCol);
            }
          }
          if (locationCol != 0) {
            ffpclj(mfptr_local,locationCol,ngroups,1,1,&groupExtver,_extnameCol);
          }
          if (uriCol != 0) {
            ffpclk(mfptr_local,uriCol,ngroups,1,1,&hdutype,_extnameCol);
          }
          local_2330 = local_548;
          if (memberPosition != 0) {
            ffrtnm(pfStack_23f8->Fptr->filename,local_1ad8,_extnameCol);
            ffrtnm(mfptr_local->Fptr->filename,local_1ee8,_extnameCol);
            if ((pfStack_23f8->Fptr == mfptr_local->Fptr) ||
               (iVar1 = strncmp(local_1ad8,local_1ee8,0x401), iVar1 == 0)) {
              ffpclb(mfptr_local,memberPosition,ngroups,1,1,(uchar *)((long)&tmpfptr + 7),
                     _extnameCol);
            }
            else {
              ffpcls(mfptr_local,memberPosition,ngroups,1,1,&local_2330,_extnameCol);
            }
          }
          local_2330 = groupAccess1 + 0x44;
          if (grptype != 0) {
            ffrtnm(pfStack_23f8->Fptr->filename,local_1ad8,_extnameCol);
            ffrtnm(mfptr_local->Fptr->filename,local_1ee8,_extnameCol);
            if ((pfStack_23f8->Fptr == mfptr_local->Fptr) ||
               (iVar1 = strncmp(local_1ad8,local_1ee8,0x401), iVar1 == 0)) {
              ffpclb(mfptr_local,grptype,ngroups,1,1,(uchar *)((long)&tmpfptr + 7),_extnameCol);
            }
            else {
              ffpcls(mfptr_local,grptype,ngroups,1,1,&local_2330,_extnameCol);
            }
          }
        }
        else if (*_extnameCol == 0) {
          local_23fc = 0x155;
          ffpmsg("Specified HDU is already a member of the Grouping table (ffgtam)");
        }
        if (*_extnameCol == 0) {
          ffflmd(pfStack_23f8,(int *)&memberExtver,_extnameCol);
          if ((iomode == 0) || ((int)memberExtver != 1)) {
            ffpmsg("cannot add GRPID/LC keywords to member HDU: (ffgtam)");
            ffpmsg(local_548);
          }
          else {
            iVar1 = ffgmng(pfStack_23f8,&grpid,_extnameCol);
            *_extnameCol = iVar1;
            groupIOstate = 1;
            memberIOstate = 0;
            while( true ) {
              bVar4 = false;
              if ((groupIOstate <= grpid) && (bVar4 = false, memberIOstate == 0)) {
                bVar4 = *_extnameCol == 0;
              }
              if (!bVar4) break;
              snprintf(local_2388,0x4b,"GRPID%d",grpid & 0xffffffff);
              iVar1 = ffgkyj(pfStack_23f8,local_2388,(long *)(memberAccess1 + 0x40),local_23e8,
                             _extnameCol);
              *_extnameCol = iVar1;
              if (stack0xffffffffffffff60 == memberID) {
                if (stack0xffffffffffffff60 < 0) {
                  snprintf(local_2388,0x4b,"GRPLC%d",grpid & 0xffffffff);
                  iVar1 = ffgkls(pfStack_20,local_2388,(char **)(memberHDUtype + 0x40),local_23e8,
                                 _extnameCol);
                  *_extnameCol = iVar1;
                  if (*_extnameCol == 0) {
                    strcpy((char *)&tgrplc,stack0xfffffffffffff290);
                    free(stack0xfffffffffffff290);
                  }
                  sVar2 = strlen((char *)(keys + 5));
                  if (sVar2 != 0) {
                    iVar1 = fits_is_url_absolute((char *)&tgrplc);
                    if ((iVar1 == 0) &&
                       (fits_path2url((char *)&tgrplc,0x401,local_16c8,_extnameCol),
                       local_16c8[0] != '/')) {
                      strcpy(local_2808,(char *)(keys + 5));
                      sVar2 = strlen(local_2808);
                      sVar3 = strlen(local_16c8);
                      if (0x400 < sVar2 + sVar3 + 1) {
                        ffpmsg("path and group location is too long (ffgtam)");
                        *_extnameCol = 0x7d;
                        goto LAB_002129a4;
                      }
                      strcat(local_2808,"/");
                      strcat(local_2808,local_16c8);
                      fits_clean_url(local_2808,(char *)&tgrplc,_extnameCol);
                    }
                    iVar1 = fits_is_url_absolute(local_12b8);
                    if ((iVar1 == 0) &&
                       (fits_path2url(local_12b8,0x401,local_16c8,_extnameCol), local_16c8[0] != '/'
                       )) {
                      strcpy(local_2808,(char *)(keys + 5));
                      sVar2 = strlen(local_2808);
                      sVar3 = strlen(local_16c8);
                      if (0x400 < sVar2 + sVar3 + 1) {
                        ffpmsg("path and group location is too long (ffgtam)");
                        *_extnameCol = 0x7d;
                        goto LAB_002129a4;
                      }
                      strcat(local_2808,"/");
                      strcat(local_2808,local_16c8);
                      fits_clean_url(local_2808,local_16c8,_extnameCol);
                    }
                  }
                  iVar1 = strcmp((char *)&tgrplc,local_16c8);
                  if (iVar1 == 0) {
                    memberIOstate = 1;
                  }
                }
                else {
                  memberIOstate = 1;
                }
              }
LAB_002129a4:
              groupIOstate = groupIOstate + 1;
            }
            if (memberIOstate == 0) {
              if (grpid == 0) {
                groupIOstate = 0;
                *_extnameCol = 0xca;
                while( true ) {
                  bVar4 = false;
                  if (groupIOstate < i) {
                    bVar4 = *_extnameCol == 0xca;
                  }
                  if (!bVar4) break;
                  *_extnameCol = 0;
                  iVar1 = ffgcrd(pfStack_23f8,tmpPtr[groupIOstate],local_23e8,_extnameCol);
                  *_extnameCol = iVar1;
                  groupIOstate = groupIOstate + 1;
                }
                if (*_extnameCol == 0xca) {
                  *_extnameCol = 0;
                  ffghsp(pfStack_23f8,&i,&groupIOstate,_extnameCol);
                  ffgrec(pfStack_23f8,i,local_23e8,_extnameCol);
                }
                if (*_extnameCol != 0) goto LAB_00212c17;
              }
              grpid = grpid + 1;
              ffrtnm(pfStack_23f8->Fptr->filename,local_1ad8,_extnameCol);
              ffrtnm(mfptr_local->Fptr->filename,local_1ee8,_extnameCol);
              if ((pfStack_23f8->Fptr == mfptr_local->Fptr) ||
                 (iVar1 = strncmp(local_1ad8,local_1ee8,0x401), iVar1 == 0)) {
                snprintf(local_2388,0x4b,"GRPID%d",grpid & 0xffffffff);
                ffikyj(pfStack_23f8,local_2388,memberID,"EXTVER of Group containing this HDU",
                       _extnameCol);
              }
              else {
                snprintf(local_2388,0x4b,"GRPID%d",grpid & 0xffffffff);
                ffikyj(pfStack_23f8,local_2388,memberID,"EXTVER of Group containing this HDU",
                       _extnameCol);
                snprintf(local_2388,0x4b,"GRPLC%d",grpid & 0xffffffff);
                ffikls(pfStack_23f8,local_2388,local_12b8,"URL of file containing Group",_extnameCol
                      );
                ffplsw(pfStack_23f8,_extnameCol);
              }
            }
            else {
              ffpmsg("HDU already has GRPID/LC keywords for group table (ffgtam)");
            }
          }
        }
      }
    }
  }
  else {
    ffpmsg("cannot modify grouping table (ffgtam)");
    *_extnameCol = 0x15d;
  }
LAB_00212c17:
  if (pfStack_20 == (fitsfile *)0x0) {
    iVar1 = ffclos(pfStack_23f8,_extnameCol);
    *_extnameCol = iVar1;
  }
  if (*_extnameCol == 0) {
    local_2838 = local_23fc;
  }
  else {
    local_2838 = *_extnameCol;
  }
  *_extnameCol = local_2838;
  return *_extnameCol;
}

Assistant:

int ffgtam(fitsfile *gfptr,   /* FITS file pointer to grouping table HDU     */
	   fitsfile *mfptr,   /* FITS file pointer to member HDU             */
	   int       hdupos,  /* member HDU position IF in the same file as
			         the grouping table AND mfptr == NULL        */
	   int      *status)  /* return status code                          */
 
/*
  add a member HDU to an existing grouping table. The fitsfile pointer gfptr
  must be positioned with the grouping table as the CHDU. The member HDU
  may either be identifed with the fitsfile *mfptr (which must be positioned
  to the member HDU) or the hdupos parameter (the HDU number of the member 
  HDU) if both reside in the same FITS file. The hdupos value is only used
  if the mfptr parameter has a value of NULL (0). The new member HDU shall 
  have the appropriate GRPIDn and GRPLCn keywords created in its header.

  Note that if the member HDU to be added to the grouping table is already
  a member of the group then it will not be added a sceond time.
*/

{
  int xtensionCol,extnameCol,extverCol,positionCol,locationCol,uriCol;
  int memberPosition = 0;
  int grptype        = 0;
  int hdutype        = 0;
  int useLocation    = 0;
  int nkeys          = 6;
  int found;
  int i;

  int memberIOstate;
  int groupIOstate;
  int iomode;

  long memberExtver = 0;
  long groupExtver  = 0;
  long memberID     = 0;
  long nmembers     = 0;
  long ngroups      = 0;
  long grpid        = 0;

  char memberAccess1[FLEN_VALUE];
  char memberAccess2[FLEN_VALUE];
  char memberFileName[FLEN_FILENAME];
  char memberLocation[FLEN_FILENAME];
  char grplc[FLEN_FILENAME];
  char *tgrplc;
  char memberHDUtype[FLEN_VALUE];
  char memberExtname[FLEN_VALUE];
  char memberURI[] = "URL";

  char groupAccess1[FLEN_VALUE];
  char groupAccess2[FLEN_VALUE];
  char groupFileName[FLEN_FILENAME];
  char groupLocation[FLEN_FILENAME];
  char tmprootname[FLEN_FILENAME], grootname[FLEN_FILENAME];
  char cwd[FLEN_FILENAME];

  char *keys[] = {"GRPNAME","EXTVER","EXTNAME","TFIELDS","GCOUNT","EXTEND"};
  char *tmpPtr[1];

  char keyword[FLEN_KEYWORD];
  char card[FLEN_CARD];

  unsigned char charNull[]  = {'\0'};

  fitsfile *tmpfptr = NULL;

  int parentStatus = 0;

  if(*status != 0) return(*status);

  do
    {
      /*
	make sure the grouping table can be modified before proceeding
      */

      fits_file_mode(gfptr,&iomode,status);

      if(iomode != READWRITE)
	{
	  ffpmsg("cannot modify grouping table (ffgtam)");
	  *status = BAD_GROUP_ATTACH;
	  continue;
	}

      /*
	 if the calling function supplied the HDU position of the member
	 HDU instead of fitsfile pointer then get a fitsfile pointer
      */

      if(mfptr == NULL)
	{
	  *status = fits_reopen_file(gfptr,&tmpfptr,status);
	  *status = fits_movabs_hdu(tmpfptr,hdupos,&hdutype,status);

	  if(*status != 0) continue;
	}
      else
	tmpfptr = mfptr;

      /*
	 determine all the information about the member HDU that will
	 be needed later; note that we establish the default values for
	 all information values that are not explicitly found
      */

      *status = fits_read_key_str(tmpfptr,"XTENSION",memberHDUtype,card,
				  status);

      if(*status == KEY_NO_EXIST) 
	{
	  strcpy(memberHDUtype,"PRIMARY");
	  *status = 0;
	}
      prepare_keyvalue(memberHDUtype);

      *status = fits_read_key_lng(tmpfptr,"EXTVER",&memberExtver,card,status);

      if(*status == KEY_NO_EXIST) 
	{
	  memberExtver = 1;
	  *status      = 0;
	}

      *status = fits_read_key_str(tmpfptr,"EXTNAME",memberExtname,card,
				  status);

      if(*status == KEY_NO_EXIST) 
	{
	  memberExtname[0] = 0;
	  *status          = 0;
	}
      prepare_keyvalue(memberExtname);

      fits_get_hdu_num(tmpfptr,&memberPosition);

      /*
	Determine if the member HDU's FITS file location needs to be
	taken into account when building its grouping table reference

	If the member location needs to be used (==> grouping table and member
	HDU reside in different files) then create an appropriate URL for
	the member HDU's file and grouping table's file. Note that the logic
	for this is rather complicated
      */

      /* SPR 3463, don't do this 
	 if(tmpfptr->Fptr == gfptr->Fptr)
	 {  */
	  /*
	    member HDU and grouping table reside in the same file, no need
	    to use the location information */
	  
      /* printf ("same file\n");
	   
	   useLocation     = 0;
	   memberIOstate   = 1;
	   *memberFileName = 0;
	}
      else
      { */ 
	  /*
	     the member HDU and grouping table FITS file location information 
	     must be used.

	     First determine the correct driver and file name for the group
	     table and member HDU files. If either are disk files then
	     construct an absolute file path for them. Finally, if both are
	     disk files construct relative file paths from the group(member)
	     file to the member(group) file.

	  */

	  /* set the USELOCATION flag to true */

	  useLocation = 1;

	  /* 
	     get the location, access type and iostate (RO, RW) of the
	     member HDU file
	  */

	  *status = fits_get_url(tmpfptr,memberFileName,memberLocation,
				 memberAccess1,memberAccess2,&memberIOstate,
				 status);

	  /*
	     if the memberFileName string is empty then use the values of
	     the memberLocation string. This corresponds to a file where
	     the "real" file is a temporary memory file, and we must assume
	     the the application really wants the original file to be the
	     group member
	   */

	  if(strlen(memberFileName) == 0)
	    {
	      strcpy(memberFileName,memberLocation);
	      strcpy(memberAccess1,memberAccess2);
	    }

	  /* 
	     get the location, access type and iostate (RO, RW) of the
	     grouping table file
	  */

	  *status = fits_get_url(gfptr,groupFileName,groupLocation,
				 groupAccess1,groupAccess2,&groupIOstate,
				 status);
	  
	  if(*status != 0) continue;

	  /*
	    the grouping table file must be writable to continue
	  */

	  if(groupIOstate == 0)
	    {
	      ffpmsg("cannot modify grouping table (ffgtam)");
	      *status = BAD_GROUP_ATTACH;
	      continue;
	    }

	  /*
	    determine how to construct the resulting URLs for the member and
	    group files
	  */

	  if(fits_strcasecmp(groupAccess1,"file://")  &&
	                                   fits_strcasecmp(memberAccess1,"file://"))
	    {
              *cwd = 0;
	      /* 
		 nothing to do in this case; both the member and group files
		 must be of an access type that already gives valid URLs;
		 i.e., URLs that we can pass directly to the file drivers
	      */
	    }
	  else
	    {
	      /*
		 retrieve the Current Working Directory as a Unix-like
		 URL standard string
	      */

	      *status = fits_get_cwd(cwd,status);

	      /*
		 create full file path for the member HDU FITS file URL
		 if it is of access type file://
	      */
	      
	      if(fits_strcasecmp(memberAccess1,"file://") == 0)
		{
		  if(*memberFileName == '/')
		    {
		      strcpy(memberLocation,memberFileName);
		    }
		  else
		    {
		      strcpy(memberLocation,cwd);
                      if (strlen(memberLocation)+strlen(memberFileName)+1 > 
                                FLEN_FILENAME-1)
                      {
                         ffpmsg("member path and filename is too long (ffgtam)");
                         *status = URL_PARSE_ERROR;
                         continue;
                      }
		      strcat(memberLocation,"/");
		      strcat(memberLocation,memberFileName);
		    }
		  
		  *status = fits_clean_url(memberLocation,memberFileName,
					   status);
		}

	      /*
		 create full file path for the grouping table HDU FITS file URL
		 if it is of access type file://
	      */

	      if(fits_strcasecmp(groupAccess1,"file://") == 0)
		{
		  if(*groupFileName == '/')
		    {
		      strcpy(groupLocation,groupFileName);
		    }
		  else
		    {
		      strcpy(groupLocation,cwd);
                      if (strlen(groupLocation)+strlen(groupFileName)+1 > 
                                FLEN_FILENAME-1)
                      {
                         ffpmsg("group path and filename is too long (ffgtam)");
                         *status = URL_PARSE_ERROR;
                         continue;
                      }
                      
		      strcat(groupLocation,"/");
		      strcat(groupLocation,groupFileName);
		    }
		  
		  *status = fits_clean_url(groupLocation,groupFileName,status);
		}

	      /*
		if both the member and group files are disk files then 
		create a relative path (relative URL) strings with 
		respect to the grouping table's file and the grouping table's 
		file with respect to the member HDU's file
	      */
	      
	      if(fits_strcasecmp(groupAccess1,"file://") == 0 &&
		                      fits_strcasecmp(memberAccess1,"file://") == 0)
		{
		  fits_url2relurl(memberFileName,groupFileName,
				                  groupLocation,status);
		  fits_url2relurl(groupFileName,memberFileName,
				                  memberLocation,status);

		  /*
		     copy the resulting partial URL strings to the
		     memberFileName and groupFileName variables for latter
		     use in the function
		   */
		    
		  strcpy(memberFileName,memberLocation);
		  strcpy(groupFileName,groupLocation);		  
		}
	    }
	  /* beo done */
	  /* }  */
      

      /* retrieve the grouping table's EXTVER value */

      *status = fits_read_key_lng(gfptr,"EXTVER",&groupExtver,card,status);

      /* 
	 if useLocation is true then make the group EXTVER value negative
	 for the subsequent GRPIDn/GRPLCn matching
      */
      /* SPR 3463 change test;  WDP added test for same filename */
      /* Now, if either the Fptr values are the same, or the root filenames
         are the same, then assume these refer to the same file.
      */
      fits_parse_rootname(tmpfptr->Fptr->filename, tmprootname, status);
      fits_parse_rootname(gfptr->Fptr->filename, grootname, status);

      if((tmpfptr->Fptr != gfptr->Fptr) && 
          strncmp(tmprootname, grootname, FLEN_FILENAME))
	   groupExtver = -1*groupExtver;

      /* retrieve the number of group members */

      *status = fits_get_num_members(gfptr,&nmembers,status);
	      
    do {

      /*
	 make sure the member HDU is not already an entry in the
	 grouping table before adding it
      */

      *status = ffgmf(gfptr,memberHDUtype,memberExtname,memberExtver,
		      memberPosition,memberFileName,&memberID,status);

      if(*status == MEMBER_NOT_FOUND) *status = 0;
      else if(*status == 0)
	{  
	  parentStatus = HDU_ALREADY_MEMBER;
    ffpmsg("Specified HDU is already a member of the Grouping table (ffgtam)");
	  continue;
	}
      else continue;

      /*
	 if the member HDU is not already recorded in the grouping table
	 then add it 
      */

      /* add a new row to the grouping table */

      *status = fits_insert_rows(gfptr,nmembers,1,status);
      ++nmembers;

      /* retrieve the grouping table column IDs and structure type */

      *status = ffgtgc(gfptr,&xtensionCol,&extnameCol,&extverCol,&positionCol,
		       &locationCol,&uriCol,&grptype,status);

      /* fill in the member HDU data in the new grouping table row */

      *tmpPtr = memberHDUtype; 

      if(xtensionCol != 0)
	fits_write_col_str(gfptr,xtensionCol,nmembers,1,1,tmpPtr,status);

      *tmpPtr = memberExtname; 

      if(extnameCol  != 0)
	{
	  if(strlen(memberExtname) != 0)
	    fits_write_col_str(gfptr,extnameCol,nmembers,1,1,tmpPtr,status);
	  else
	    /* WILL THIS WORK FOR VAR LENTH CHAR COLS??????*/
	    fits_write_col_byt(gfptr,extnameCol,nmembers,1,1,charNull,status);
	}

      if(extverCol   != 0)
	fits_write_col_lng(gfptr,extverCol,nmembers,1,1,&memberExtver,
			   status);

      if(positionCol != 0)
	fits_write_col_int(gfptr,positionCol,nmembers,1,1,
			   &memberPosition,status);

      *tmpPtr = memberFileName; 

      if(locationCol != 0)
	{
	  /* Change the test for SPR 3463 */
	  /* Now, if either the Fptr values are the same, or the root filenames
	     are the same, then assume these refer to the same file.
	  */
	  fits_parse_rootname(tmpfptr->Fptr->filename, tmprootname, status);
	  fits_parse_rootname(gfptr->Fptr->filename, grootname, status);

	  if((tmpfptr->Fptr != gfptr->Fptr) && 
	          strncmp(tmprootname, grootname, FLEN_FILENAME))
	    fits_write_col_str(gfptr,locationCol,nmembers,1,1,tmpPtr,status);
	  else
	    /* WILL THIS WORK FOR VAR LENTH CHAR COLS??????*/
	    fits_write_col_byt(gfptr,locationCol,nmembers,1,1,charNull,status);
	}

      *tmpPtr = memberURI;

      if(uriCol      != 0)
	{

	  /* Change the test for SPR 3463 */
	  /* Now, if either the Fptr values are the same, or the root filenames
	     are the same, then assume these refer to the same file.
	  */
	  fits_parse_rootname(tmpfptr->Fptr->filename, tmprootname, status);
	  fits_parse_rootname(gfptr->Fptr->filename, grootname, status);

	  if((tmpfptr->Fptr != gfptr->Fptr) && 
	          strncmp(tmprootname, grootname, FLEN_FILENAME))
	    fits_write_col_str(gfptr,uriCol,nmembers,1,1,tmpPtr,status);
	  else
	    /* WILL THIS WORK FOR VAR LENTH CHAR COLS??????*/
	    fits_write_col_byt(gfptr,uriCol,nmembers,1,1,charNull,status);
	}
    } while(0);

      if(0 != *status) continue;
      /*
	 add GRPIDn/GRPLCn keywords to the member HDU header to link
	 it to the grouing table if the they do not already exist and
	 the member file is RW
      */

      fits_file_mode(tmpfptr,&iomode,status);
 
     if(memberIOstate == 0 || iomode != READWRITE) 
	{
	  ffpmsg("cannot add GRPID/LC keywords to member HDU: (ffgtam)");
	  ffpmsg(memberFileName);
	  continue;
	}

      *status = fits_get_num_groups(tmpfptr,&ngroups,status);

      /* 
	 look for the GRPID/LC keywords in the member HDU; if the keywords
	 for the back-link to the grouping table already exist then no
	 need to add them again
       */

      for(i = 1, found = 0; i <= ngroups && !found && *status == 0; ++i)
	{
	  snprintf(keyword,FLEN_KEYWORD,"GRPID%d",(int)ngroups);
	  *status = fits_read_key_lng(tmpfptr,keyword,&grpid,card,status);

	  if(grpid == groupExtver)
	    {
	      if(grpid < 0)
		{

		  /* have to make sure the GRPLCn keyword matches too */

		  snprintf(keyword,FLEN_KEYWORD,"GRPLC%d",(int)ngroups);
		  /* SPR 1738 */
		  *status = fits_read_key_longstr(mfptr,keyword,&tgrplc,card,
						  status);
		  if (0 == *status) {
		    strcpy(grplc,tgrplc);
		    free(tgrplc);
		  }
		  
		  /*
		     always compare files using absolute paths
                     the presence of a non-empty cwd indicates
                     that the file names may require conversion
                     to absolute paths
                  */

                  if(0 < strlen(cwd)) {
                    /* temp buffer for use in assembling abs. path(s) */
                    char tmp[FLEN_FILENAME];

                    /* make grplc absolute if necessary */
                    if(!fits_is_url_absolute(grplc)) {
		      fits_path2url(grplc,FLEN_FILENAME,groupLocation,status);

		      if(groupLocation[0] != '/')
			{
			  strcpy(tmp, cwd);
                          if (strlen(tmp)+strlen(groupLocation)+1 > 
                                    FLEN_FILENAME-1)
                          {
                             ffpmsg("path and group location is too long (ffgtam)");
                             *status = URL_PARSE_ERROR;
                             continue;
                          }
			  strcat(tmp,"/");
			  strcat(tmp,groupLocation);
			  fits_clean_url(tmp,grplc,status);
			}
                    }

                    /* make groupFileName absolute if necessary */
                    if(!fits_is_url_absolute(groupFileName)) {
		      fits_path2url(groupFileName,FLEN_FILENAME,groupLocation,status);

		      if(groupLocation[0] != '/')
			{
			  strcpy(tmp, cwd);
                          if (strlen(tmp)+strlen(groupLocation)+1 > 
                                    FLEN_FILENAME-1)
                          {
                             ffpmsg("path and group location is too long (ffgtam)");
                             *status = URL_PARSE_ERROR;
                             continue;
                          }
			  strcat(tmp,"/");
			  strcat(tmp,groupLocation);
                          /*
                             note: use groupLocation (which is not used
                             below this block), to store the absolute
                             file name instead of using groupFileName.
                             The latter may be needed unaltered if the
                             GRPLC is written below
                          */

			  fits_clean_url(tmp,groupLocation,status);
			}
                    }
                  }
		  /*
		    see if the grplc value and the group file name match
		  */

		  if(strcmp(grplc,groupLocation) == 0) found = 1;
		}
	      else
		{
		  /* the match is found with GRPIDn alone */
		  found = 1;
		}
	    }
	}

      /*
	 if FOUND is true then no need to continue
      */

      if(found)
	{
	  ffpmsg("HDU already has GRPID/LC keywords for group table (ffgtam)");
	  continue;
	}

      /*
	 add the GRPID/LC keywords to the member header for this grouping
	 table
	 
	 If NGROUPS == 0 then we must position the header pointer to the
	 record where we want to insert the GRPID/LC keywords (the pointer
	 is already correctly positioned if the above search loop activiated)
      */

      if(ngroups == 0)
	{
	  /* 
	     no GRPIDn/GRPLCn keywords currently exist in header so try
	     to position the header pointer to a desirable position
	  */
	  
	  for(i = 0, *status = KEY_NO_EXIST; 
	                       i < nkeys && *status == KEY_NO_EXIST; ++i)
	    {
	      *status = 0;
	      *status = fits_read_card(tmpfptr,keys[i],card,status);
	    }
	      
	  /* all else fails: move write pointer to end of header */
	      
	  if(*status == KEY_NO_EXIST)
	    {
	      *status = 0;
	      fits_get_hdrspace(tmpfptr,&nkeys,&i,status);
	      ffgrec(tmpfptr,nkeys,card,status);
	    }
	  
	  /* any other error status then abort */
	  
	  if(*status != 0) continue;
	}
      
      /* 
	 now that the header pointer is positioned for the GRPID/LC 
	 keyword insertion increment the number of group links counter for 
	 the member HDU 
      */

      ++ngroups;

      /*
	 if the member HDU and grouping table reside in the same FITS file
	 then there is no need to add a GRPLCn keyword
      */
      /* SPR 3463 change test */
      /* Now, if either the Fptr values are the same, or the root filenames
	 are the same, then assume these refer to the same file.
      */
      fits_parse_rootname(tmpfptr->Fptr->filename, tmprootname, status);
      fits_parse_rootname(gfptr->Fptr->filename, grootname, status);

      if((tmpfptr->Fptr == gfptr->Fptr) || 
	          strncmp(tmprootname, grootname, FLEN_FILENAME) == 0)
	{
	  /* add the GRPIDn keyword only */

	  snprintf(keyword,FLEN_KEYWORD,"GRPID%d",(int)ngroups);
	  fits_insert_key_lng(tmpfptr,keyword,groupExtver,
			      "EXTVER of Group containing this HDU",status);
	}
      else 
	{
	  /* add the GRPIDn and GRPLCn keywords */

	  snprintf(keyword,FLEN_KEYWORD,"GRPID%d",(int)ngroups);
	  fits_insert_key_lng(tmpfptr,keyword,groupExtver,
			      "EXTVER of Group containing this HDU",status);

	  snprintf(keyword,FLEN_KEYWORD,"GRPLC%d",(int)ngroups);
	  /* SPR 1738 */
	  fits_insert_key_longstr(tmpfptr,keyword,groupFileName,
			      "URL of file containing Group",status);
	  fits_write_key_longwarn(tmpfptr,status);

	}

    }while(0);

  /* close the tmpfptr pointer if it was opened in this function */

  if(mfptr == NULL)
    {
      *status = fits_close_file(tmpfptr,status);
    }

  *status = 0 == *status ? parentStatus : *status;

  return(*status);
}